

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_conjunction.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundConjunctionExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  ExpressionType EVar1;
  reference result_00;
  const_reference this_00;
  type expr_00;
  reference pvVar2;
  InternalException *this_01;
  ulong __n;
  allocator local_109;
  idx_t local_108;
  BoundConjunctionExpression *local_100;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_f8;
  DataChunk *local_f0;
  ExpressionExecutor *local_e8;
  vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
  *local_e0;
  SelectionVector *local_d8;
  string local_d0;
  LogicalType local_b0;
  Vector intermediate;
  
  local_f0 = &state->intermediate_chunk;
  local_108 = count;
  local_e8 = this;
  local_d8 = sel;
  DataChunk::Reset(local_f0);
  local_f8 = &expr->children;
  local_e0 = &state->child_states;
  __n = 0;
  local_100 = expr;
  do {
    if ((ulong)((long)(local_100->children).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_100->children).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      return;
    }
    result_00 = vector<duckdb::Vector,_true>::get<true>(&local_f0->data,__n);
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(local_f8,__n);
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(this_00);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
             ::get<true>(local_e0,__n);
    Execute(local_e8,expr_00,
            (pvVar2->
            super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
            .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,local_d8,local_108
            ,result_00);
    if (__n == 0) {
      Vector::Reference(result,result_00);
    }
    else {
      LogicalType::LogicalType(&local_b0,BOOLEAN);
      Vector::Vector(&intermediate,&local_b0,0x800);
      LogicalType::~LogicalType(&local_b0);
      EVar1 = (local_100->super_Expression).super_BaseExpression.type;
      if (EVar1 == CONJUNCTION_AND) {
        VectorOperations::And(result_00,result,&intermediate,local_108);
      }
      else {
        if (EVar1 != CONJUNCTION_OR) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&local_d0,"Unknown conjunction type!",&local_109)
          ;
          InternalException::InternalException(this_01,&local_d0);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        VectorOperations::Or(result_00,result,&intermediate,local_108);
      }
      Vector::Reference(result,&intermediate);
      Vector::~Vector(&intermediate);
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void ExpressionExecutor::Execute(const BoundConjunctionExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	// execute the children
	state->intermediate_chunk.Reset();
	for (idx_t i = 0; i < expr.children.size(); i++) {
		auto &current_result = state->intermediate_chunk.data[i];
		Execute(*expr.children[i], state->child_states[i].get(), sel, count, current_result);
		if (i == 0) {
			// move the result
			result.Reference(current_result);
		} else {
			Vector intermediate(LogicalType::BOOLEAN);
			// AND/OR together
			switch (expr.GetExpressionType()) {
			case ExpressionType::CONJUNCTION_AND:
				VectorOperations::And(current_result, result, intermediate, count);
				break;
			case ExpressionType::CONJUNCTION_OR:
				VectorOperations::Or(current_result, result, intermediate, count);
				break;
			default:
				throw InternalException("Unknown conjunction type!");
			}
			result.Reference(intermediate);
		}
	}
}